

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::AddInterfaceEntries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,string *prop,
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          *entries)

{
  bool bVar1;
  LinkImplementationLibraries *this_00;
  pointer pcVar2;
  reference pcVar3;
  cmCompiledGeneratorExpression *this_01;
  TargetPropertyEntry *this_02;
  auto_ptr<cmCompiledGeneratorExpression> local_108;
  TargetPropertyEntry *local_100;
  cmGeneratorExpression local_f8;
  cmCompiledGeneratorExpression *local_f0;
  auto_ptr<cmCompiledGeneratorExpression> local_e8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string genex;
  const_iterator end;
  const_iterator it;
  LinkImplementationLibraries *impl;
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  *entries_local;
  string *prop_local;
  string *config_local;
  cmTarget *thisTarget_local;
  cmTargetInternals *this_local;
  
  this_00 = cmTarget::GetLinkImplementationLibraries(thisTarget,config);
  if (this_00 != (LinkImplementationLibraries *)0x0) {
    end = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this_00->Libraries);
    genex.field_2._8_8_ =
         std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this_00->Libraries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                    *)((long)&genex.field_2 + 8)), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator->(&end);
      if ((pcVar2->super_cmLinkItem).Target != (cmTarget *)0x0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator*(&end);
        std::operator+(&local_c8,"$<TARGET_PROPERTY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar3);
        std::operator+(&local_a8,&local_c8,",");
        std::operator+(&local_88,&local_a8,prop);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,">");
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator->(&end);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)&cge,&pcVar2->Backtrace);
        cmGeneratorExpression::Parse(&local_f8,(string *)&cge);
        local_f0 = (cmCompiledGeneratorExpression *)
                   cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_f8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                  (&local_e8,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_f0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_f8);
        this_01 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_e8);
        cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_01,true);
        this_02 = (TargetPropertyEntry *)operator_new(0x10);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_108,&local_e8);
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator*(&end);
        TargetPropertyEntry::TargetPropertyEntry(this_02,&local_108,pcVar3);
        local_100 = this_02;
        std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::push_back(entries,&local_100);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_108);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_e8);
        cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
        std::__cxx11::string::~string((string *)local_68);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&end);
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddInterfaceEntries(
  cmTarget const* thisTarget, std::string const& config,
  std::string const& prop, std::vector<TargetPropertyEntry*>& entries)
{
  if(cmTarget::LinkImplementationLibraries const* impl =
     thisTarget->GetLinkImplementationLibraries(config))
    {
    for (std::vector<cmLinkImplItem>::const_iterator
           it = impl->Libraries.begin(), end = impl->Libraries.end();
         it != end; ++it)
      {
      if(it->Target)
        {
        std::string genex =
          "$<TARGET_PROPERTY:" + *it + "," + prop + ">";
        cmGeneratorExpression ge(&it->Backtrace);
        cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(
          new cmTargetInternals::TargetPropertyEntry(cge, *it));
        }
      }
    }
}